

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManUtilSkipSpaces(Prs_Man_t *p)

{
  int iVar1;
  Prs_Man_t *p_local;
  
  while( true ) {
    if (p->pLimit <= p->pCur) {
      iVar1 = Prs_ManErrorSet(p,"Unexpectedly reached end-of-file.",1);
      return iVar1;
    }
    while (iVar1 = Prs_CharIsSpace(*p->pCur), iVar1 != 0) {
      p->pCur = p->pCur + 1;
    }
    if (*p->pCur == '\0') break;
    iVar1 = Prs_ManUtilSkipComments(p);
    if (iVar1 == 0) {
      return 0;
    }
  }
  iVar1 = Prs_ManErrorSet(p,"Unexpectedly reached end-of-file.",1);
  return iVar1;
}

Assistant:

static inline int Prs_ManUtilSkipSpaces( Prs_Man_t * p )
{
    while ( p->pCur < p->pLimit )
    {
        while ( Prs_CharIsSpace(*p->pCur) ) 
            p->pCur++;
        if ( !*p->pCur )
            return Prs_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
        if ( !Prs_ManUtilSkipComments(p) )
            return 0;
    }
    return Prs_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
}